

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O2

void stressTest(void)

{
  ostream *poVar1;
  initializer_list<double> __l;
  undefined1 local_a0 [8];
  vector<double,_std::allocator<double>_> input;
  undefined1 local_58 [8];
  NeuralNet nn;
  vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> layerDefs;
  allocator_type local_11;
  
  nn.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  input.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)CONCAT44(input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,0x32);
  local_58._0_4_ = relu;
  std::vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>>::
  emplace_back<int,PyreNet::LayerDefinition::activationType>
            ((vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>> *)
             &nn.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (int *)&input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(activationType *)local_58);
  input.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)CONCAT44(input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,0x32);
  local_58._0_4_ = relu;
  std::vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>>::
  emplace_back<int,PyreNet::LayerDefinition::activationType>
            ((vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>> *)
             &nn.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (int *)&input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(activationType *)local_58);
  input.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)CONCAT44(input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,0x32);
  local_58._0_4_ = relu;
  std::vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>>::
  emplace_back<int,PyreNet::LayerDefinition::activationType>
            ((vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>> *)
             &nn.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (int *)&input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(activationType *)local_58);
  input.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)CONCAT44(input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,2);
  local_58._0_4_ = relu;
  std::vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>>::
  emplace_back<int,PyreNet::LayerDefinition::activationType>
            ((vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>> *)
             &nn.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (int *)&input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(activationType *)local_58);
  PyreNet::NeuralNet::NeuralNet
            ((NeuralNet *)local_58,5,
             (vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> *)
             &nn.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  PyreNet::NeuralNet::mutate_uniform((NeuralNet *)local_58,0.0,0.1,-1);
  input.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __l._M_len = 5;
  __l._M_array = (iterator)
                 &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_a0,__l,&local_11);
  poVar1 = std::operator<<((ostream *)&std::cout,"Stress test complete");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)local_a0);
  std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::~vector
            ((vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_> *)&nn);
  std::_Vector_base<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_>::
  ~_Vector_base((_Vector_base<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> *
                )&nn.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void stressTest() {
    std::vector<PyreNet::LayerDefinition> layerDefs;
    layerDefs.emplace_back(50, PyreNet::LayerDefinition::activationType::relu);
    layerDefs.emplace_back(50, PyreNet::LayerDefinition::activationType::relu);
    layerDefs.emplace_back(50, PyreNet::LayerDefinition::activationType::relu);
    layerDefs.emplace_back(2, PyreNet::LayerDefinition::activationType::relu);
    PyreNet::NeuralNet nn(5, layerDefs);
    nn.mutate_uniform(0, 0.1);
    std::vector<double> input{0,1,2,3,4};
    std::cout << "Stress test complete" << std::endl;
}